

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::lazyPrintRunInfo(ConsoleReporter *this)

{
  char *__lhs;
  bool bVar1;
  ostream *poVar2;
  Colour colour;
  allocator local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  poVar2 = std::operator<<((this->super_StreamingReporterBase).stream,"\n");
  if (getLineOfChars<(char)126>()::line == '\0') {
    uRam00000000001654d0 = 0x7e7e7e7e7e7e7e;
    uRam00000000001654d7._0_1_ = '~';
    uRam00000000001654d7._1_1_ = '~';
    uRam00000000001654d7._2_1_ = '~';
    uRam00000000001654d7._3_1_ = '~';
    uRam00000000001654d7._4_1_ = '~';
    uRam00000000001654d7._5_1_ = '~';
    uRam00000000001654d7._6_1_ = '~';
    uRam00000000001654d7._7_1_ = '~';
    DAT_001654c0 = '~';
    DAT_001654c0_1._0_1_ = '~';
    DAT_001654c0_1._1_1_ = '~';
    DAT_001654c0_1._2_1_ = '~';
    DAT_001654c0_1._3_1_ = '~';
    DAT_001654c0_1._4_1_ = '~';
    DAT_001654c0_1._5_1_ = '~';
    DAT_001654c0_1._6_1_ = '~';
    uRam00000000001654c8 = 0x7e7e7e7e7e7e7e;
    DAT_001654cf = 0x7e;
    DAT_001654b0 = '~';
    DAT_001654b0_1._0_1_ = '~';
    DAT_001654b0_1._1_1_ = '~';
    DAT_001654b0_1._2_1_ = '~';
    DAT_001654b0_1._3_1_ = '~';
    DAT_001654b0_1._4_1_ = '~';
    DAT_001654b0_1._5_1_ = '~';
    DAT_001654b0_1._6_1_ = '~';
    uRam00000000001654b8._0_1_ = '~';
    uRam00000000001654b8._1_1_ = '~';
    uRam00000000001654b8._2_1_ = '~';
    uRam00000000001654b8._3_1_ = '~';
    uRam00000000001654b8._4_1_ = '~';
    uRam00000000001654b8._5_1_ = '~';
    uRam00000000001654b8._6_1_ = '~';
    uRam00000000001654b8._7_1_ = '~';
    DAT_001654a0 = '~';
    DAT_001654a0_1._0_1_ = '~';
    DAT_001654a0_1._1_1_ = '~';
    DAT_001654a0_1._2_1_ = '~';
    DAT_001654a0_1._3_1_ = '~';
    DAT_001654a0_1._4_1_ = '~';
    DAT_001654a0_1._5_1_ = '~';
    DAT_001654a0_1._6_1_ = '~';
    uRam00000000001654a8._0_1_ = '~';
    uRam00000000001654a8._1_1_ = '~';
    uRam00000000001654a8._2_1_ = '~';
    uRam00000000001654a8._3_1_ = '~';
    uRam00000000001654a8._4_1_ = '~';
    uRam00000000001654a8._5_1_ = '~';
    uRam00000000001654a8._6_1_ = '~';
    uRam00000000001654a8._7_1_ = '~';
    getLineOfChars<(char)126>()::line = '~';
    getLineOfChars<(char)126>()::line_1._0_1_ = '~';
    getLineOfChars<(char)126>()::line_1._1_1_ = '~';
    getLineOfChars<(char)126>()::line_1._2_1_ = '~';
    getLineOfChars<(char)126>()::line_1._3_1_ = '~';
    getLineOfChars<(char)126>()::line_1._4_1_ = '~';
    getLineOfChars<(char)126>()::line_1._5_1_ = '~';
    getLineOfChars<(char)126>()::line_1._6_1_ = '~';
    uRam0000000000165498._0_1_ = '~';
    uRam0000000000165498._1_1_ = '~';
    uRam0000000000165498._2_1_ = '~';
    uRam0000000000165498._3_1_ = '~';
    uRam0000000000165498._4_1_ = '~';
    uRam0000000000165498._5_1_ = '~';
    uRam0000000000165498._6_1_ = '~';
    uRam0000000000165498._7_1_ = '~';
    DAT_001654df = 0;
  }
  poVar2 = std::operator<<(poVar2,&getLineOfChars<(char)126>()::line);
  std::operator<<(poVar2,"\n");
  colour.m_moved = false;
  Colour::use(FileName);
  poVar2 = std::operator<<((this->super_StreamingReporterBase).stream,
                           (string *)
                           (this->super_StreamingReporterBase).currentTestRunInfo.
                           super_Option<Catch::TestRunInfo>.nullableValue);
  poVar2 = std::operator<<(poVar2," is a Catch v");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,".");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," b");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  __lhs = DAT_00165418;
  std::__cxx11::string::string((string *)&local_38,"master",&local_39);
  bVar1 = std::operator!=(__lhs,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (bVar1) {
    poVar2 = std::operator<<((this->super_StreamingReporterBase).stream," (");
    poVar2 = std::operator<<(poVar2,DAT_00165418);
    std::operator<<(poVar2,")");
  }
  poVar2 = std::operator<<((this->super_StreamingReporterBase).stream," host application.\n");
  std::operator<<(poVar2,"Run with -? for options\n\n");
  (this->super_StreamingReporterBase).currentTestRunInfo.used = true;
  Colour::~Colour(&colour);
  return;
}

Assistant:

void lazyPrintRunInfo() {
            stream  << "\n" << getLineOfChars<'~'>() << "\n";
            Colour colour( Colour::SecondaryText );
            stream  << currentTestRunInfo->name
                    << " is a Catch v"  << libraryVersion.majorVersion << "."
                    << libraryVersion.minorVersion << " b"
                    << libraryVersion.buildNumber;
            if( libraryVersion.branchName != std::string( "master" ) )
                stream << " (" << libraryVersion.branchName << ")";
            stream  << " host application.\n"
                    << "Run with -? for options\n\n";

            currentTestRunInfo.used = true;
        }